

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# canvas_drawing.h
# Opt level: O1

void dlib::fill_rect_with_vertical_gradient<dlib::rgb_alpha_pixel>
               (canvas *c,rectangle *rect,rgb_alpha_pixel *pixel_top,rgb_alpha_pixel *pixel_bottom,
               rectangle *area_)

{
  ushort uVar1;
  undefined2 uVar2;
  undefined2 uVar3;
  undefined2 uVar4;
  long lVar5;
  long lVar6;
  uint3 uVar7;
  uint5 uVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  bool bVar15;
  rgb_alpha_pixel pixel;
  matrix<long,_4L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout> m_1;
  matrix<long,_4L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout> m;
  rgb_alpha_pixel local_bc;
  undefined1 *local_b8;
  long local_b0;
  undefined1 *local_a8;
  long local_a0;
  undefined1 **local_98;
  undefined1 **local_90;
  undefined1 ***local_88;
  long local_80;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  lVar5 = rect->t;
  lVar12 = (c->super_rectangle).l;
  lVar11 = (c->super_rectangle).t;
  if (lVar12 < rect->l) {
    lVar12 = rect->l;
  }
  if (lVar11 < lVar5) {
    lVar11 = lVar5;
  }
  lVar13 = (c->super_rectangle).b;
  lVar6 = rect->b;
  if (lVar6 <= lVar13) {
    lVar13 = lVar6;
  }
  if (lVar12 <= area_->l) {
    lVar12 = area_->l;
  }
  if (lVar11 <= area_->t) {
    lVar11 = area_->t;
  }
  if (area_->b < lVar13) {
    lVar13 = area_->b;
  }
  if (lVar11 <= lVar13) {
    lVar10 = (c->super_rectangle).r;
    lVar9 = rect->r;
    if (lVar10 < rect->r) {
      lVar9 = lVar10;
    }
    if (area_->r < lVar9) {
      lVar9 = area_->r;
    }
    do {
      local_a0 = rect->b - lVar11;
      local_b0 = lVar11 - rect->t;
      uVar1._0_1_ = pixel_top->red;
      uVar1._1_1_ = pixel_top->green;
      local_58._0_2_ = uVar1 & 0xff;
      local_58._2_6_ = 0;
      local_58[8] = uVar1._1_1_;
      local_58._9_7_ = 0;
      uVar2._0_1_ = pixel_top->blue;
      uVar2._1_1_ = pixel_top->alpha;
      uVar7 = CONCAT12(uVar2._1_1_,uVar2);
      uVar8 = CONCAT14(uVar2._1_1_,(uint)uVar7);
      local_48._0_8_ = (ulong)(uVar8 & 0xffffff00ff) & 0xffff;
      local_48[8] = uVar2._1_1_;
      local_48._9_7_ = 0;
      local_a8 = local_58;
      uVar3._0_1_ = pixel_bottom->red;
      uVar3._1_1_ = pixel_bottom->green;
      uVar7 = CONCAT12(uVar3._1_1_,uVar3);
      uVar8 = CONCAT14(uVar3._1_1_,(uint)uVar7);
      local_78._0_8_ = (ulong)(uVar8 & 0xffffff00ff) & 0xffff;
      local_78[8] = uVar3._1_1_;
      local_78._9_7_ = 0;
      uVar4._0_1_ = pixel_bottom->blue;
      uVar4._1_1_ = pixel_bottom->alpha;
      uVar7 = CONCAT12(uVar4._1_1_,uVar4);
      uVar8 = CONCAT14(uVar4._1_1_,(uint)uVar7);
      local_68._0_8_ = (ulong)(uVar8 & 0xffffff00ff) & 0xffff;
      local_68[8] = uVar4._1_1_;
      local_68._9_7_ = 0;
      local_b8 = local_78;
      local_98 = &local_a8;
      local_90 = &local_b8;
      local_88 = &local_98;
      local_80 = lVar6 - lVar5;
      vector_to_pixel_helper<dlib::rgb_alpha_pixel,4>::
      assign<dlib::matrix_exp<dlib::matrix_div_scal_exp<dlib::matrix_add_exp<dlib::matrix_mul_scal_exp<dlib::matrix<long,4l,1l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>,true>,dlib::matrix_mul_scal_exp<dlib::matrix<long,4l,1l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>,true>>>>>
                (&local_bc,
                 (matrix_exp<dlib::matrix_div_scal_exp<dlib::matrix_add_exp<dlib::matrix_mul_scal_exp<dlib::matrix<long,_4L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>,_true>,_dlib::matrix_mul_scal_exp<dlib::matrix<long,_4L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>,_true>_>_>_>
                  *)&local_88);
      lVar10 = lVar12 * 4;
      lVar14 = (lVar9 - lVar12) + 1;
      if (lVar12 <= lVar9) {
        do {
          assign_pixel_helpers::assign<dlib::canvas::pixel,dlib::rgb_alpha_pixel>
                    ((pixel *)(c->bits +
                              lVar10 + (lVar11 - (c->super_rectangle).t) * c->row_width +
                                       (c->super_rectangle).l * -4),&local_bc);
          lVar10 = lVar10 + 4;
          lVar14 = lVar14 + -1;
        } while (lVar14 != 0);
      }
      bVar15 = lVar11 != lVar13;
      lVar11 = lVar11 + 1;
    } while (bVar15);
  }
  return;
}

Assistant:

void fill_rect_with_vertical_gradient (
        const canvas& c,
        const rectangle& rect,
        const pixel_type& pixel_top,
        const pixel_type& pixel_bottom,
        const rectangle& area_ = rectangle(std::numeric_limits<long>::min(), std::numeric_limits<long>::min(),
                                          std::numeric_limits<long>::max(), std::numeric_limits<long>::max())
    )
    {
        rectangle area = rect.intersect(c).intersect(area_);
        pixel_type pixel;

        const long s = rect.bottom()-rect.top();

        for (long y = area.top(); y <= area.bottom(); ++y)
        {
            const long t = rect.bottom()-y;
            const long b = y-rect.top();
            vector_to_pixel(pixel,
                    ((pixel_to_vector<long>(pixel_top)*t + 
                      pixel_to_vector<long>(pixel_bottom)*b)/s));

            for (long x = area.left(); x <= area.right(); ++x)
            {
                assign_pixel(c[y-c.top()][x-c.left()], pixel);
            }
        }
    }